

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O2

bool __thiscall LinuxRawSocket::setOutputInterface(LinuxRawSocket *this,string *interface_name)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->socket_fd;
  if (iVar1 != -1) {
    iVar2 = getInterfaceIndex(this,interface_name);
    (this->output_interface).sll_ifindex = iVar2;
  }
  return iVar1 != -1;
}

Assistant:

bool LinuxRawSocket::setOutputInterface(const std::string& interface_name)
{
    // Operation cannot complete successfully without an open socket
    if (socket_fd == -1)
    {
        return false;
    }

    // Retrieve the index of the desired interface
    output_interface.sll_ifindex = getInterfaceIndex(interface_name);

    return true;
}